

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.hpp
# Opt level: O0

void __thiscall effolkronium::seeder_default::seeder_default(seeder_default *this)

{
  initializer_list<unsigned_long> __il;
  result_type_conflict6 rVar1;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_13d8;
  duration<long,_std::ratio<1L,_1000000000L>_> local_13d0 [3];
  random_device local_13b8;
  ulong local_30;
  rep local_28;
  iterator local_20;
  undefined8 local_18;
  seeder_default *local_10;
  seeder_default *this_local;
  
  local_10 = this;
  std::random_device::random_device(&local_13b8);
  rVar1 = std::random_device::operator()(&local_13b8);
  local_30 = (ulong)rVar1;
  local_13d8.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  local_13d0[0].__r =
       (rep)std::chrono::
            time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            ::time_since_epoch(&local_13d8);
  local_28 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(local_13d0);
  local_20 = &local_30;
  local_18 = 2;
  __il._M_len = 2;
  __il._M_array = local_20;
  std::seed_seq::seed_seq<unsigned_long,void>(&this->seed_seq,__il);
  std::random_device::~random_device(&local_13b8);
  return;
}

Assistant:

std::seed_seq& operator() ( ) {
            // MinGW issue, std::random_device returns constant value
            // Use std::seed_seq with additional seed from C++ chrono
            return seed_seq;
        }